

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O0

LispPTR DSK_getfilename(LispPTR *args)

{
  int iVar1;
  uint uVar2;
  LispPTR LVar3;
  LispPTR *pLVar4;
  char *pcVar5;
  DLword *pDVar6;
  size_t sVar7;
  LispPTR local_431c;
  ulong local_4318;
  ulong local_4308;
  size_t lf_i_2;
  char *lf_dptr_2;
  char *lf_sptr_2;
  LispPTR *lf_naddress_1;
  size_t lf_i_1;
  char *lf_dptr_1;
  char *lf_sptr_1;
  LispPTR *lf_naddress;
  char *lf_cp2_2;
  char *lf_cp1_2;
  char *lf_cp2_1;
  char *lf_cp1_1;
  char *lf_cp2;
  char *lf_cp1;
  size_t lf_ii;
  size_t lf_i;
  char *lf_dptr;
  char *lf_sptr;
  size_t lf_length;
  short *lf_sbase;
  char *lf_dp;
  char *lf_base;
  OneDArray *lf_arrayp_1;
  OneDArray *lf_arrayp;
  char ver [16];
  char name [255];
  char dir [4096];
  char file [4096];
  char vname [4096];
  char aname [255];
  char lfname [4096];
  uint local_30;
  int fatp;
  int dirp;
  int rval;
  size_t len;
  char *base;
  LispPTR *args_local;
  
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);
    pLVar4 = NativeAligned4FromLAddr(*args);
    if (*(char *)((long)pLVar4 + 6) == 'C') {
      _dirp = (long)(int)pLVar4[2];
      lfname[0xffc] = '\0';
      lfname[0xffd] = '\0';
      lfname[0xffe] = '\0';
      lfname[0xfff] = '\0';
    }
    else if (*(char *)((long)pLVar4 + 6) == 'D') {
      _dirp = (long)(int)(pLVar4[2] << 1);
      lfname[0xffc] = '\x01';
      lfname[0xffd] = '\0';
      lfname[0xffe] = '\0';
      lfname[0xfff] = '\0';
    }
    else {
      error("LispStringLength: Not a character array.\n");
    }
    if (lfname._4092_4_ == 0) {
      local_4318 = _dirp + 3;
    }
    else {
      local_4318 = _dirp + 5;
    }
    if (local_4318 < 0x1001) {
      pLVar4 = NativeAligned4FromLAddr(*args);
      if ((int)pLVar4[2] < 0x1000) {
        local_431c = pLVar4[2];
      }
      else {
        local_431c = 0x1000;
      }
      pcVar5 = (char *)(long)(int)local_431c;
      if (*(char *)((long)pLVar4 + 6) == 'C') {
        pDVar6 = NativeAligned2FromLAddr(*pLVar4 & 0xfffffff);
        lf_i = (size_t)(aname + 0xf8);
        lf_dptr = (char *)((long)pDVar6 + (long)(int)(uint)(ushort)pLVar4[1]);
        for (lf_ii = 0; lf_ii < pcVar5; lf_ii = lf_ii + 1) {
          *(undefined1 *)lf_i = *(undefined1 *)((ulong)lf_dptr ^ 3);
          lf_i = lf_i + 1;
          lf_dptr = lf_dptr + 1;
        }
        (aname + 0xf8)[(long)pcVar5] = '\0';
      }
      else if (*(char *)((long)pLVar4 + 6) == 'D') {
        pDVar6 = NativeAligned2FromLAddr(*pLVar4 & 0xfffffff);
        lf_length = (size_t)(pDVar6 + (int)(uint)(ushort)pLVar4[1]);
        lf_sbase = (short *)(aname + 0xf8);
        for (lf_cp1 = (char *)0x0; lf_cp1 < pcVar5; lf_cp1 = lf_cp1 + 1) {
          *(char *)lf_sbase = (char)*(undefined2 *)(lf_length ^ 2);
          lf_length = lf_length + 2;
          lf_sbase = (short *)((long)lf_sbase + 1);
        }
        *(undefined1 *)lf_sbase = 0;
      }
      else {
        error("LispStringToCString: Not a character array.\n");
      }
      iVar1 = unixpathname(aname + 0xf8,dir + 0xff8,1,0);
      if (iVar1 == 0) {
        args_local._4_4_ = 0;
      }
      else {
        iVar1 = unpack_filename(dir + 0xff8,name + 0xf8,ver + 8,(char *)&lf_arrayp,1);
        if (iVar1 == 0) {
          args_local._4_4_ = 0;
        }
        else {
          uVar2 = args[1] - 0xe0000;
          if (uVar2 < 5 || args[1] == 0xe0005) {
            switch((long)&switchD_0012f529::switchdataD_00174954 +
                   (long)(int)(&switchD_0012f529::switchdataD_00174954)[uVar2]) {
            case 0x12f52b:
              iVar1 = true_name(name + 0xf8);
              if (iVar1 != -1) {
                return 0;
              }
              iVar1 = strcmp(ver + 8,"");
              if (iVar1 == 0) {
                strcpy(vname + 0xff8,name + 0xf8);
                strcpy(file + 0xff8,name + 0xf8);
                local_30 = 1;
              }
              else {
                iVar1 = get_version_array(name + 0xf8,ver + 8);
                if (iVar1 == 0) {
                  return 0;
                }
                if ((char)lf_arrayp == '\0') {
                  strcpy(vname + 0xff8,ver + 8);
                }
                else {
                  strcpy(vname + 0xff8,ver + 8);
                  strcat(vname + 0xff8,".~");
                  strcat(vname + 0xff8,(char *)&lf_arrayp);
                  strcat(vname + 0xff8,"~");
                }
                iVar1 = get_old(name + 0xf8,VA.files,vname + 0xff8,file + 0xff8);
                if (iVar1 == 0) {
                  return 0;
                }
                iVar1 = true_name(vname + 0xff8);
                if (iVar1 == 0) {
                  return 0;
                }
                if (iVar1 == -1) {
                  strcpy(file + 0xff8,vname + 0xff8);
                }
                local_30 = (uint)(iVar1 == -1);
              }
              break;
            case 0x12f6a9:
              iVar1 = true_name(name + 0xf8);
              if (iVar1 != -1) {
                return 0;
              }
              iVar1 = strcmp(ver + 8,"");
              if (iVar1 == 0) {
                strcpy(vname + 0xff8,name + 0xf8);
                strcpy(file + 0xff8,name + 0xf8);
                local_30 = 1;
              }
              else {
                iVar1 = get_version_array(name + 0xf8,ver + 8);
                if (iVar1 == 0) {
                  return 0;
                }
                if ((char)lf_arrayp == '\0') {
                  strcpy(vname + 0xff8,ver + 8);
                }
                else {
                  strcpy(vname + 0xff8,ver + 8);
                  strcat(vname + 0xff8,".~");
                  strcat(vname + 0xff8,(char *)&lf_arrayp);
                  strcat(vname + 0xff8,"~");
                }
                iVar1 = get_oldest(name + 0xf8,VA.files,vname + 0xff8,file + 0xff8);
                if (iVar1 == 0) {
                  return 0;
                }
                iVar1 = true_name(vname + 0xff8);
                if (iVar1 == 0) {
                  return 0;
                }
                if (iVar1 == -1) {
                  strcpy(file + 0xff8,vname + 0xff8);
                }
                local_30 = (uint)(iVar1 == -1);
              }
              break;
            case 0x12f827:
              iVar1 = true_name(name + 0xf8);
              if (iVar1 == -1) {
                iVar1 = strcmp(ver + 8,"");
                if (iVar1 == 0) {
                  strcpy(vname + 0xff8,name + 0xf8);
                  strcpy(file + 0xff8,name + 0xf8);
                  local_30 = 1;
                }
                else {
                  lf_cp2 = name + 0xf8;
                  for (lf_cp1_1 = name + 0xf8; *lf_cp1_1 != '\0'; lf_cp1_1 = lf_cp1_1 + 1) {
                    if (*lf_cp1_1 == '/') {
                      lf_cp2 = lf_cp1_1;
                    }
                  }
                  if (lf_cp2 == lf_cp1_1 + -1) {
                    if (lf_cp2 == name + 0xf8) {
                      strcpy(vname + 0xff8,"/");
                      strcat(vname + 0xff8,ver + 8);
                    }
                    else {
                      strcpy(vname + 0xff8,name + 0xf8);
                      strcat(vname + 0xff8,ver + 8);
                    }
                  }
                  else {
                    strcpy(vname + 0xff8,name + 0xf8);
                    strcat(vname + 0xff8,"/");
                    strcat(vname + 0xff8,ver + 8);
                  }
                  iVar1 = true_name(vname + 0xff8);
                  if (iVar1 == -1) {
                    strcpy(file + 0xff8,vname + 0xff8);
                    local_30 = 1;
                  }
                  else {
                    iVar1 = get_version_array(name + 0xf8,ver + 8);
                    if (iVar1 == 0) {
                      return 0;
                    }
                    if ((char)lf_arrayp == '\0') {
                      strcpy(vname + 0xff8,ver + 8);
                    }
                    else {
                      strcpy(vname + 0xff8,ver + 8);
                      strcat(vname + 0xff8,".~");
                      strcat(vname + 0xff8,(char *)&lf_arrayp);
                      strcat(vname + 0xff8,"~");
                    }
                    iVar1 = get_new(name + 0xf8,VA.files,vname + 0xff8,file + 0xff8);
                    if (iVar1 == 0) {
                      return 0;
                    }
                    local_30 = 0;
                  }
                }
              }
              else {
                strcpy(file + 0xff8,dir + 0xff8);
                local_30 = 0;
              }
              break;
            case 0x12fad2:
              iVar1 = true_name(name + 0xf8);
              if (iVar1 == -1) {
                lf_cp2_1 = name + 0xf8;
                for (lf_cp1_2 = name + 0xf8; *lf_cp1_2 != '\0'; lf_cp1_2 = lf_cp1_2 + 1) {
                  if (*lf_cp1_2 == '/') {
                    lf_cp2_1 = lf_cp1_2;
                  }
                }
                if (lf_cp2_1 == lf_cp1_2 + -1) {
                  if (lf_cp2_1 == name + 0xf8) {
                    strcpy(vname + 0xff8,"/");
                    strcat(vname + 0xff8,ver + 8);
                  }
                  else {
                    strcpy(vname + 0xff8,name + 0xf8);
                    strcat(vname + 0xff8,ver + 8);
                  }
                }
                else {
                  strcpy(vname + 0xff8,name + 0xf8);
                  strcat(vname + 0xff8,"/");
                  strcat(vname + 0xff8,ver + 8);
                }
                iVar1 = true_name(vname + 0xff8);
                if (iVar1 == -1) {
                  strcpy(file + 0xff8,vname + 0xff8);
                  local_30 = 1;
                }
                else {
                  iVar1 = get_version_array(name + 0xf8,ver + 8);
                  if (iVar1 == 0) {
                    return 0;
                  }
                  if ((char)lf_arrayp == '\0') {
                    strcpy(vname + 0xff8,ver + 8);
                  }
                  else {
                    strcpy(vname + 0xff8,ver + 8);
                    strcat(vname + 0xff8,".~");
                    strcat(vname + 0xff8,(char *)&lf_arrayp);
                    strcat(vname + 0xff8,"~");
                  }
                  iVar1 = get_old_new(name + 0xf8,VA.files,vname + 0xff8,file + 0xff8);
                  if (iVar1 == 0) {
                    return 0;
                  }
                  local_30 = 0;
                }
              }
              else {
                strcpy(file + 0xff8,dir + 0xff8);
                local_30 = 0;
              }
              break;
            case 0x12fd31:
              iVar1 = true_name(name + 0xf8);
              if (iVar1 != -1) {
                return 0;
              }
              lf_cp2_2 = name + 0xf8;
              for (lf_naddress = (LispPTR *)(name + 0xf8); (char)*lf_naddress != '\0';
                  lf_naddress = (LispPTR *)((long)lf_naddress + 1)) {
                if ((char)*lf_naddress == '/') {
                  lf_cp2_2 = (char *)lf_naddress;
                }
              }
              if (lf_cp2_2 == (char *)((long)lf_naddress + -1)) {
                if (lf_cp2_2 == name + 0xf8) {
                  strcpy(file + 0xff8,"/");
                  strcat(file + 0xff8,ver + 8);
                }
                else {
                  strcpy(file + 0xff8,name + 0xf8);
                  strcat(file + 0xff8,ver + 8);
                }
              }
              else {
                strcpy(file + 0xff8,name + 0xf8);
                strcat(file + 0xff8,"/");
                strcat(file + 0xff8,ver + 8);
              }
              strcpy(vname + 0xff8,file + 0xff8);
              iVar1 = true_name(vname + 0xff8);
              if (iVar1 == -1) {
                strcpy(file + 0xff8,vname + 0xff8);
              }
              local_30 = (uint)(iVar1 == -1);
              iVar1 = lisppathname(file + 0xff8,aname + 0xf8,local_30,0);
              if (iVar1 == 0) {
                return 0;
              }
              pLVar4 = NativeAligned4FromLAddr(args[2]);
              lf_i_1 = (size_t)NativeAligned2FromLAddr(*pLVar4 & 0xfffffff);
              sVar7 = strlen(aname + 0xf8);
              lf_dptr_1 = aname + 0xf8;
              for (lf_naddress_1 = (LispPTR *)0x0; lf_naddress_1 < (LispPTR *)(sVar7 + 1);
                  lf_naddress_1 = (LispPTR *)((long)lf_naddress_1 + 1)) {
                *(char *)(lf_i_1 ^ 3) = *lf_dptr_1;
                lf_i_1 = lf_i_1 + 1;
                lf_dptr_1 = lf_dptr_1 + 1;
              }
              LVar3 = GetPosSmallp(sVar7);
              return LVar3;
            }
          }
          if (local_30 == 0) {
            iVar1 = lisppathname(file + 0xff8,aname + 0xf8,0,1);
            if (iVar1 == 0) {
              args_local._4_4_ = 0;
            }
            else {
              pLVar4 = NativeAligned4FromLAddr(args[2]);
              lf_i_2 = (size_t)NativeAligned2FromLAddr(*pLVar4 & 0xfffffff);
              sVar7 = strlen(aname + 0xf8);
              lf_dptr_2 = aname + 0xf8;
              for (local_4308 = 0; local_4308 < sVar7 + 1; local_4308 = local_4308 + 1) {
                *(char *)(lf_i_2 ^ 3) = *lf_dptr_2;
                lf_i_2 = lf_i_2 + 1;
                lf_dptr_2 = lf_dptr_2 + 1;
              }
              args_local._4_4_ = GetPosSmallp(sVar7);
            }
          }
          else {
            args_local._4_4_ = 0;
          }
        }
      }
    }
    else {
      *Lisp_errno = 200;
      args_local._4_4_ = 0;
    }
  }
  else {
    *Lisp_errno = 100;
    args_local._4_4_ = 0;
  }
  return args_local._4_4_;
}

Assistant:

LispPTR DSK_getfilename(LispPTR *args)
{
  char *base;
  size_t len;
  int rval;
  int dirp;
  int fatp;
  char lfname[MAXPATHLEN];
  char aname[MAXNAMLEN];
  char vname[MAXPATHLEN];
  char file[MAXPATHLEN];
  char dir[MAXPATHLEN];
  char name[MAXNAMLEN];
  char ver[VERSIONLEN];
#ifdef DOS
  char drive[1], rawname[MAXNAMLEN];
  int extlen; /* len of extension, for making backup filename */
#endif        /* DOS */

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);

  LispStringLength(args[0], len, fatp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  len = fatp ? len + 4 + 1 : len + 2 + 1;
  if (len > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);

#ifdef DOS
  separate_drive(lfname, drive);
#endif

/*
 * Convert a Lisp file name to UNIX one.  This is a DSK device method.
 * Thus we have to convert a version field too.  Third argument for
 * unixpathname specifies it.
 */
#ifdef DOS
  if (unixpathname(lfname, file, 1, 0, drive, &extlen, rawname) == 0) return (NIL);
#else
  if (unixpathname(lfname, file, 1, 0) == 0) return (NIL);
#endif

  if (unpack_filename(file, dir, name, ver, 1) == 0) return (NIL);

  switch (args[1]) {
    case RECOG_OLD:
      /*
       * "Old" file means the "newest existing" file.  Thus, we have to
       * check dir is an existing directory or not.  The search has to
       * be done in case insensitive manner.  true_name does this work.
       */

      if (true_name(dir) != -1) {
        /* No such directory. */
        return (NIL);
      }
      /*
       * At this point, true_name has converted dir to the "true" name
       * of the directory.
       */
      if (strcmp(name, "") == 0) {
        /*
         * The file name is specified with a trail directory delimiter.
         * We should recognize it as a directory.
         */
        strcpy(aname, dir);
        strcpy(vname, dir);
        dirp = 1;
      } else {
        /*
         * Recognizing a file on DSK device needs the version information.
         * We gather version information in a version array first.
         */
        if (get_version_array(dir, name) == 0) return (NIL);

        ConcNameAndVersion(name, ver, aname);
        if (get_old(dir, VA.files, aname, vname) == 0) return (NIL);

        if ((rval = true_name(aname)) == 0) return (NIL);
        if (rval == -1) {
          /*
           * The specified file is a directory file.
           */
          strcpy(vname, aname);
          dirp = 1;
        } else {
#ifdef DOS
          strcpy(vname, aname);
#endif
          dirp = 0;
        }
      }

      break;

    case RECOG_OLDEST:
      /*
       * "Oldest" file means the "oldest existing" file.  Thus, we have to
       * check dir is an existing directory or not.
       */
      if (true_name(dir) != -1) {
        /* No such directory. */
        return (NIL);
      }
      if (strcmp(name, "") == 0) {
        /*
         * The file name is specified with a trail directory delimiter.
         * We should recognize it as a directory.
         */
        strcpy(aname, dir);
        strcpy(vname, dir);
        dirp = 1;
      } else {
        if (get_version_array(dir, name) == 0) return (NIL);

        ConcNameAndVersion(name, ver, aname);
        if (get_oldest(dir, VA.files, aname, vname) == 0) return (NIL);

        if ((rval = true_name(aname)) == 0) return (NIL);
        if (rval == -1) {
          /*
           * The specified file is a directory file.
           */
          strcpy(vname, aname);
          dirp = 1;
        } else {
#ifdef DOS
          strcpy(vname, aname);
#endif
          dirp = 0;
        }
      }
      break;

    case RECOG_NEW:
      /*
       * "New" file means the "not existing" file.  Thus it is not
       * necessary that dir is an existing directory.  If dir is not
       * an existing directory, we returns the specified file name
       * as if, the subsequent OPENFILE will find the truth.
       */
      if (true_name(dir) != -1) {
        strcpy(vname, file);
        dirp = 0;
      } else if (strcmp(name, "") == 0) {
        /*
         * The file name is specified with a trail directory delimiter.
         * We should recognize it as a directory.
         */
        strcpy(aname, dir);
        strcpy(vname, dir);
        dirp = 1;
      } else {
        ConcDirAndName(dir, name, aname);
        if ((rval = true_name(aname)) == -1) {
          strcpy(vname, aname);
          dirp = 1;
        } else {
          /*
           * Here, dir is an existing directory.  We have to perform
           * "new" recognition with the version information.
           */
          if (get_version_array(dir, name) == 0) return (NIL);

          ConcNameAndVersion(name, ver, aname);
          if (get_new(dir, VA.files, aname, vname) == 0) return (NIL);
          dirp = 0;
        }
      }
      break;

    case RECOG_OLD_NEW:
      /*
       * "Old/new" file means the "newest existing" or "not existing" file.
       * Thus, if dir is not an existing directory, we can return the
       * specified file name.  If it is an existing one, we have to
       * try "old" recognition on the directory first.  If the recognition
       * fails, we try "new" recognition.
       */
      if (true_name(dir) != -1) {
        strcpy(vname, file);
        dirp = 0;
      } else {
        ConcDirAndName(dir, name, aname);
        if ((rval = true_name(aname)) == -1) {
          strcpy(vname, aname);
          dirp = 1;
        } else {
          if (get_version_array(dir, name) == 0) return (NIL);

          ConcNameAndVersion(name, ver, aname);
          if (get_old_new(dir, VA.files, aname, vname) == 0) return (NIL);
          dirp = 0;
        }
      }
      break;

    case RECOG_NON:
      /*
       * "Non" recognition is used to recognize a sysout file.  The sysout
       * file is dealt with specially, it does not have any version, even
       * if it is on {DSK} device.  Only we have to do here is to make
       * sure the path to reach to the specified file is an existing
       * directories.  The file name itself is recognized as if.
       */
      if (true_name(dir) != -1) return (NIL);
      ConcDirAndName(dir, name, vname);
      strcpy(aname, vname);
      if (true_name(aname) == -1) {
        strcpy(vname, aname);
        dirp = 1;
      } else {
        dirp = 0;
      }
      if (lisppathname(vname, lfname, dirp, 0) == 0) return (NIL);
      STRING_BASE(args[2], base);
      len = strlen(lfname);

#ifndef BYTESWAP
      strncpy(base, lfname, len + 1);
#else
      StrNCpyFromCToLisp(base, lfname, len + 1);
#endif /* BYTESWAP */

      return (GetPosSmallp(len));
  }

  /*
   * DSK device does not recognize a directory file as a file.  Thus we should
   * return NIL when the recognized file is a directory.
   */
  if (dirp) return (NIL);

/*
 * Now, vname holds the "versioned" full name of the recognized file in UNIX
 * format.  We have to convert it back to Lisp format.  The version field
 * have to be converted.  The fourth argument for lisppathname specifies it.
 */
#ifdef DOS
  /* For DOS, have to assure we use the name asked for, not the */
  /* faked-up oversion-0 name, so reported names match. */
  {
    char dver[VERSIONLEN];
    separate_version(vname, dver, 0);
    ConcDirAndName(dir, name, aname);
    ConcNameAndVersion(aname, dver, vname);
  }
#endif /* DOS */

  if (lisppathname(vname, lfname, dirp, (dirp ? 0 : 1)) == 0) return (NIL);

  STRING_BASE(args[2], base);
  len = strlen(lfname);

#ifndef BYTESWAP
  strncpy(base, lfname, len + 1);
#else
  StrNCpyFromCToLisp(base, lfname, len + 1);
#endif /* BYTESWAP */

  return (GetPosSmallp(len));
}